

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O3

PermissionStatus QPermissions::Private::checkPermission(QPermission *permission)

{
  undefined8 uVar1;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  undefined1 local_48 [16];
  QDebug local_38;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcPermissions();
  if (((byte)QtPrivateLogging::lcPermissions::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    QMessageLogger::debug((QMessageLogger *)local_48);
    uVar1 = local_48._0_8_;
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"No permission backend on this platform.";
    QString::fromUtf8(&local_30,(QString *)0x27,ba);
    ::QTextStream::operator<<((QTextStream *)uVar1,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(bool *)(local_48._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    uVar1 = local_48._0_8_;
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)"Optimistically returning Granted for";
    QString::fromUtf8(&local_30,(QString *)0x24,ba_00);
    ::QTextStream::operator<<((QTextStream *)uVar1,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(bool *)(local_48._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    ((Stream *)local_48._0_8_)->ref = ((Stream *)local_48._0_8_)->ref + 1;
    ::operator<<((Stream *)&local_38,(QPermission *)(local_48 + 8));
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug((QDebug *)(local_48 + 8));
    QDebug::~QDebug((QDebug *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return Granted;
  }
  __stack_chk_fail();
}

Assistant:

Qt::PermissionStatus checkPermission(const QPermission &permission)
    {
        qCDebug(lcPermissions) << "No permission backend on this platform."
            << "Optimistically returning Granted for" << permission;
        return Qt::PermissionStatus::Granted;
    }